

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5_utils.c
# Opt level: O2

void MD5Final(uchar *digest,MD5Context *ctx)

{
  uint *in;
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  uint *__s;
  
  uVar3 = ctx->bytes[0] & 0x3f;
  in = ctx->in;
  __s = (uint *)((long)ctx->in + (ulong)uVar3 + 1);
  *(undefined1 *)((long)ctx->in + (ulong)uVar3) = 0x80;
  uVar2 = 0x37 - uVar3;
  if (0x37 < uVar3) {
    memset(__s,0,(ulong)(uVar3 ^ 0x3f));
    MD5Transform(ctx->buf,in);
    uVar2 = 0x38;
    __s = in;
  }
  memset(__s,0,(ulong)uVar2);
  uVar2 = ctx->bytes[0];
  uVar3 = ctx->bytes[1];
  ctx->in[0xe] = uVar2 * 8;
  ctx->in[0xf] = uVar3 << 3 | uVar2 >> 0x1d;
  MD5Transform(ctx->buf,in);
  uVar1 = *(undefined8 *)(ctx->buf + 2);
  *(undefined8 *)digest = *(undefined8 *)ctx->buf;
  *(undefined8 *)(digest + 8) = uVar1;
  ctx->bytes[0] = 0;
  ctx->bytes[1] = 0;
  ctx->in[0] = 0;
  ctx->in[1] = 0;
  ctx->in[2] = 0;
  ctx->in[3] = 0;
  ctx->in[4] = 0;
  ctx->in[5] = 0;
  ctx->in[6] = 0;
  ctx->in[7] = 0;
  ctx->in[8] = 0;
  ctx->in[9] = 0;
  ctx->in[10] = 0;
  ctx->in[0xb] = 0;
  ctx->in[0xc] = 0;
  ctx->in[0xd] = 0;
  ctx->buf[0] = 0;
  ctx->buf[1] = 0;
  ctx->buf[2] = 0;
  ctx->buf[3] = 0;
  ctx->in[0xe] = 0;
  ctx->in[0xf] = 0;
  return;
}

Assistant:

void MD5Final(md5byte digest[16], struct MD5Context *ctx) {
  int count = ctx->bytes[0] & 0x3f; /* Number of bytes in ctx->in */
  md5byte *p = (md5byte *)ctx->in + count;

  /* Set the first char of padding to 0x80.  There is always room. */
  *p++ = 0x80;

  /* Bytes of padding needed to make 56 bytes (-8..55) */
  count = 56 - 1 - count;

  if (count < 0) { /* Padding forces an extra block */
    memset(p, 0, count + 8);
    byteSwap(ctx->in, 16);
    MD5Transform(ctx->buf, ctx->in);
    p = (md5byte *)ctx->in;
    count = 56;
  }

  memset(p, 0, count);
  byteSwap(ctx->in, 14);

  /* Append length in bits and transform */
  ctx->in[14] = ctx->bytes[0] << 3;
  ctx->in[15] = ctx->bytes[1] << 3 | ctx->bytes[0] >> 29;
  MD5Transform(ctx->buf, ctx->in);

  byteSwap(ctx->buf, 4);
  memcpy(digest, ctx->buf, 16);
  memset(ctx, 0, sizeof(*ctx)); /* In case it's sensitive */
}